

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_make_path_table_2(archive_write *a,vdd *vdd,int depth,int *dir_number)

{
  path_table *ppVar1;
  int iVar2;
  isoent *piVar3;
  int iVar4;
  isoent **__base;
  path_table *ppVar5;
  isoent **ppiVar6;
  long lVar7;
  size_t __nmemb;
  
  ppVar1 = vdd->pathtbl + depth;
  __nmemb = (size_t)vdd->pathtbl[depth].cnt;
  if (__nmemb == 0) {
    ppVar1->sorted = (isoent **)0x0;
    iVar4 = 0;
  }
  else {
    __base = (isoent **)malloc(__nmemb * 8);
    if (__base == (isoent **)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      iVar4 = -0x1e;
    }
    else {
      ppVar1->sorted = __base;
      ppVar5 = ppVar1;
      ppiVar6 = __base;
      while (piVar3 = ppVar5->first, piVar3 != (isoent *)0x0) {
        *ppiVar6 = piVar3;
        ppiVar6 = ppiVar6 + 1;
        ppVar5 = (path_table *)&piVar3->ptnext;
      }
      if ((ulong)vdd->vdd_type < 3) {
        qsort(__base,__nmemb,8,(__compar_fn_t)(&PTR__compare_path_table_00293120)[vdd->vdd_type]);
      }
      iVar4 = 0;
      for (lVar7 = 0; lVar7 < ppVar1->cnt; lVar7 = lVar7 + 1) {
        iVar2 = *dir_number;
        *dir_number = iVar2 + 1;
        __base[lVar7]->dir_number = iVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
isoent_make_path_table_2(struct archive_write *a, struct vdd *vdd,
    int depth, int *dir_number)
{
	struct isoent *np;
	struct isoent **enttbl;
	struct path_table *pt;
	int i;

	pt = &vdd->pathtbl[depth];
	if (pt->cnt == 0) {
		pt->sorted = NULL;
		return (ARCHIVE_OK);
	}
	enttbl = malloc(pt->cnt * sizeof(struct isoent *));
	if (enttbl == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	pt->sorted = enttbl;
	for (np = pt->first; np != NULL; np = np->ptnext)
		*enttbl ++ = np;
	enttbl = pt->sorted;

	switch (vdd->vdd_type) {
	case VDD_PRIMARY:
	case VDD_ENHANCED:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table);
#endif
		break;
	case VDD_JOLIET:
#ifdef __COMPAR_FN_T
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    (__compar_fn_t)_compare_path_table_joliet);
#else
		qsort(enttbl, pt->cnt, sizeof(struct isoent *),
		    _compare_path_table_joliet);
#endif
		break;
	}
	for (i = 0; i < pt->cnt; i++)
		enttbl[i]->dir_number = (*dir_number)++;

	return (ARCHIVE_OK);
}